

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_divs_16_d(void)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if ((m68ki_cpu.dar[m68ki_cpu.ir & 7] & 0xffff) == 0) {
    m68ki_exception_trap(5);
    return;
  }
  uVar3 = m68ki_cpu.ir >> 9 & 7;
  iVar4 = (int)(short)m68ki_cpu.dar[m68ki_cpu.ir & 7];
  lVar1 = (long)(int)m68ki_cpu.dar[uVar3] / (long)iVar4;
  uVar2 = (uint)lVar1;
  if ((int)(short)lVar1 != uVar2) {
    m68ki_cpu.v_flag = 0x80;
    return;
  }
  m68ki_cpu.n_flag = (int)uVar2 >> 8;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.not_z_flag = uVar2;
  m68ki_cpu.dar[uVar3] = (int)m68ki_cpu.dar[uVar3] % iVar4 << 0x10 | uVar2 & 0xffff;
  return;
}

Assistant:

static void m68k_op_divs_16_d(void)
{
	uint* r_dst = &DX;
	sint src = MAKE_INT_16(DY);
	sint quotient;
	sint remainder;

	if(src != 0)
	{
		if((uint32)*r_dst == 0x80000000 && src == -1)
		{
			FLAG_Z = 0;
			FLAG_N = NFLAG_CLEAR;
			FLAG_V = VFLAG_CLEAR;
			FLAG_C = CFLAG_CLEAR;
			*r_dst = 0;
			return;
		}

		quotient = MAKE_INT_32(*r_dst) / src;
		remainder = MAKE_INT_32(*r_dst) % src;

		if(quotient == MAKE_INT_16(quotient))
		{
			FLAG_Z = quotient;
			FLAG_N = NFLAG_16(quotient);
			FLAG_V = VFLAG_CLEAR;
			FLAG_C = CFLAG_CLEAR;
			*r_dst = MASK_OUT_ABOVE_32(MASK_OUT_ABOVE_16(quotient) | (remainder << 16));
			return;
		}
		FLAG_V = VFLAG_SET;
		return;
	}
	m68ki_exception_trap(EXCEPTION_ZERO_DIVIDE);
}